

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O0

size_t __thiscall chatra::Tuple::find(Tuple *this,StringTable *sTable,StringId key)

{
  bool bVar1;
  pointer pvVar2;
  pointer pvVar3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_78 [3];
  string local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  local_40;
  const_iterator it1;
  _Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false> local_30;
  const_iterator it0;
  StringId key_local;
  StringTable *sTable_local;
  Tuple *this_local;
  
  it0.super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>._M_cur.
  _4_4_ = key;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<chatra::StringId,_unsigned_long,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_unsigned_long>_>_>
       ::find(&this->sidToIndex,
              (key_type *)
              ((long)&it0.
                      super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>
                      ._M_cur + 4));
  it1.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
             )std::
              unordered_map<chatra::StringId,_unsigned_long,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_unsigned_long>_>_>
              ::end(&this->sidToIndex);
  bVar1 = std::__detail::operator!=
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false> *
                     )&it1);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_chatra::StringId,_unsigned_long>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_chatra::StringId,_unsigned_long>,_false,_false>
                         *)&local_30);
    this_local = (Tuple *)pvVar2->second;
  }
  else {
    StringTable::ref_abi_cxx11_
              (&local_60,sTable,
               it0.
               super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>.
               _M_cur._4_4_);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::find(&this->strToIndex,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    local_78[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::end(&this->strToIndex);
    bVar1 = std::__detail::operator!=(&local_40,local_78);
    if (bVar1) {
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>
                             *)&local_40);
      this_local = (Tuple *)pvVar3->second;
    }
    else {
      this_local = (Tuple *)0xffffffffffffffff;
    }
  }
  return (size_t)this_local;
}

Assistant:

size_t Tuple::find(const StringTable* sTable, StringId key) const {
	auto it0 = sidToIndex.find(key);
	if (it0 != sidToIndex.end())
		return it0->second;

	auto it1 = strToIndex.find(sTable->ref(key));
	if (it1 != strToIndex.end())
		return it1->second;

	return SIZE_MAX;
}